

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void UYVYToUVRow_C(uint8 *src_uyvy,int src_stride_uyvy,uint8 *dst_u,uint8 *dst_v,int width)

{
  int local_30;
  int x;
  int width_local;
  uint8 *dst_v_local;
  uint8 *dst_u_local;
  byte *pbStack_10;
  int src_stride_uyvy_local;
  uint8 *src_uyvy_local;
  
  _x = dst_v;
  dst_v_local = dst_u;
  pbStack_10 = src_uyvy;
  for (local_30 = 0; local_30 < width; local_30 = local_30 + 2) {
    *dst_v_local = (uint8)((int)((uint)*pbStack_10 + (uint)pbStack_10[src_stride_uyvy] + 1) >> 1);
    *_x = (uint8)((int)((uint)pbStack_10[2] + (uint)pbStack_10[src_stride_uyvy + 2] + 1) >> 1);
    pbStack_10 = pbStack_10 + 4;
    dst_v_local = dst_v_local + 1;
    _x = _x + 1;
  }
  return;
}

Assistant:

void UYVYToUVRow_C(const uint8* src_uyvy,
                   int src_stride_uyvy,
                   uint8* dst_u,
                   uint8* dst_v,
                   int width) {
  // Output a row of UV values.
  int x;
  for (x = 0; x < width; x += 2) {
    dst_u[0] = (src_uyvy[0] + src_uyvy[src_stride_uyvy + 0] + 1) >> 1;
    dst_v[0] = (src_uyvy[2] + src_uyvy[src_stride_uyvy + 2] + 1) >> 1;
    src_uyvy += 4;
    dst_u += 1;
    dst_v += 1;
  }
}